

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O2

Matrix4f * __thiscall
eos::fitting::RenderingParameters::get_modelview
          (Matrix4f *__return_storage_ptr__,RenderingParameters *this)

{
  DenseStorage<float,_16,_4,_4,_0> *pDVar1;
  float fVar2;
  float *pfVar3;
  Matrix4f *modelview;
  long lStack_a0;
  MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> aMStack_98 [16];
  Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false> local_88;
  Matrix<float,_3,_3,_0,_3,_3> local_54;
  
  local_88.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false>,_0>.m_data =
       (PointerType)__return_storage_ptr__;
  local_88.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_xpr =
       __return_storage_ptr__;
  if (this->camera_type == Orthographic) {
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)__return_storage_ptr__,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&local_88);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::normalized(aMStack_98);
    Eigen::QuaternionBase<Eigen::Quaternion<float,_0>_>::toRotationMatrix
              ((QuaternionBase<Eigen::Quaternion<float,_0>_> *)aMStack_98);
    local_88.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_startRow.m_value
         = 0;
    local_88.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_startCol.m_value
         = 0;
    local_88.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_outerStride = 4;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,3,3,false>,Eigen::Matrix<float,3,3,0,3,3>>
              (&local_88,&local_54);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xc] = this->t_x;
    pfVar3 = &this->t_y;
    lStack_a0 = 0x34;
  }
  else {
    if ((this->t_z).super__Optional_base<float,_true,_true>._M_payload.
        super__Optional_payload_base<float>._M_engaged == false) {
      __assert_fail("t_z.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/RenderingParameters.hpp"
                    ,0xe7,"Eigen::Matrix4f eos::fitting::RenderingParameters::get_modelview() const"
                   );
    }
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
    Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
              ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)__return_storage_ptr__,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
                *)&local_88);
    Eigen::MatrixBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::normalized(aMStack_98);
    Eigen::QuaternionBase<Eigen::Quaternion<float,_0>_>::toRotationMatrix
              ((QuaternionBase<Eigen::Quaternion<float,_0>_> *)aMStack_98);
    local_88.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_startRow.m_value
         = 0;
    local_88.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_startCol.m_value
         = 0;
    local_88.super_BlockImpl<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_outerStride = 4;
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,3,3,false>,Eigen::Matrix<float,3,3,0,3,3>>
              (&local_88,&local_54);
    fVar2 = this->t_y;
    pDVar1 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar1->m_data).array[0xc] = this->t_x;
    (pDVar1->m_data).array[0xd] = fVar2;
    pfVar3 = std::optional<float>::value(&this->t_z);
    lStack_a0 = 0x38;
  }
  *(float *)((long)(__return_storage_ptr__->
                   super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.m_data.
                   array + lStack_a0) = *pfVar3;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4f get_modelview() const
    {
        if (camera_type == CameraType::Orthographic)
        {
            Eigen::Matrix4f modelview = Eigen::Matrix4f::Identity();
            modelview.block<3, 3>(0, 0) = rotation.normalized().toRotationMatrix();
            modelview(0, 3) = t_x;
            modelview(1, 3) = t_y;
            return modelview;
        } else
        {
            assert(t_z.has_value()); // Might be worth throwing an exception instead.
            Eigen::Matrix4f modelview = Eigen::Matrix4f::Identity();
            modelview.block<3, 3>(0, 0) = rotation.normalized().toRotationMatrix();
            modelview(0, 3) = t_x;
            modelview(1, 3) = t_y;
            modelview(2, 3) = t_z.value();
            return modelview;
        }
    }